

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_result ma_lpf2_reinit(ma_lpf2_config *pConfig,ma_lpf2 *pLPF)

{
  double dVar1;
  ma_result mVar2;
  double __x;
  double dVar3;
  ma_biquad_config bqConfig;
  ma_biquad_config local_48;
  
  if (pConfig == (ma_lpf2_config *)0x0 || pLPF == (ma_lpf2 *)0x0) {
    return MA_INVALID_ARGS;
  }
  dVar1 = pConfig->q;
  __x = (pConfig->cutoffFrequency * 6.283185307179586) / (double)pConfig->sampleRate;
  dVar3 = sin(__x);
  local_48.a1 = sin(1.5707963267948966 - __x);
  dVar3 = dVar3 / (dVar1 + dVar1);
  local_48.b1 = 1.0 - local_48.a1;
  local_48.b0 = local_48.b1 * 0.5;
  local_48.a0 = dVar3 + 1.0;
  local_48.a1 = local_48.a1 * -2.0;
  local_48.a2 = 1.0 - dVar3;
  local_48.format = pConfig->format;
  local_48.channels = pConfig->channels;
  local_48.b2 = local_48.b0;
  mVar2 = ma_biquad_reinit(&local_48,&pLPF->bq);
  return mVar2;
}

Assistant:

MA_API ma_result ma_lpf2_reinit(const ma_lpf2_config* pConfig, ma_lpf2* pLPF)
{
    ma_result result;
    ma_biquad_config bqConfig;

    if (pLPF == NULL || pConfig == NULL) {
        return MA_INVALID_ARGS;
    }

    bqConfig = ma_lpf2__get_biquad_config(pConfig);
    result = ma_biquad_reinit(&bqConfig, &pLPF->bq);
    if (result != MA_SUCCESS) {
        return result;
    }

    return MA_SUCCESS;
}